

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

Layer * createLayerItem(Layer *layerData,VArenaAlloc *allocator)

{
  ImageLayer *pIVar1;
  VArenaAlloc *in_RSI;
  long in_RDI;
  Layer *local_10;
  VArenaAlloc *local_8;
  
  switch(*(undefined1 *)(in_RDI + 0x31)) {
  case 0:
    pIVar1 = (ImageLayer *)
             VArenaAlloc::
             make<rlottie::internal::renderer::CompLayer,rlottie::internal::model::Layer*&,VArenaAlloc*&>
                       (in_RSI,&local_10,&local_8);
    break;
  case 1:
    pIVar1 = (ImageLayer *)
             VArenaAlloc::
             make<rlottie::internal::renderer::SolidLayer,rlottie::internal::model::Layer*&>
                       (in_RSI,&local_10);
    break;
  case 2:
    pIVar1 = VArenaAlloc::
             make<rlottie::internal::renderer::ImageLayer,rlottie::internal::model::Layer*&>
                       (in_RSI,&local_10);
    break;
  case 3:
    pIVar1 = (ImageLayer *)
             VArenaAlloc::
             make<rlottie::internal::renderer::NullLayer,rlottie::internal::model::Layer*&>
                       (in_RSI,&local_10);
    break;
  case 4:
    pIVar1 = (ImageLayer *)
             VArenaAlloc::
             make<rlottie::internal::renderer::ShapeLayer,rlottie::internal::model::Layer*&,VArenaAlloc*&>
                       (in_RSI,&local_10,&local_8);
    break;
  default:
    pIVar1 = (ImageLayer *)0x0;
  }
  return &pIVar1->super_Layer;
}

Assistant:

static renderer::Layer *createLayerItem(model::Layer *layerData,
                                        VArenaAlloc * allocator)
{
    switch (layerData->mLayerType) {
    case model::Layer::Type::Precomp: {
        return allocator->make<renderer::CompLayer>(layerData, allocator);
    }
    case model::Layer::Type::Solid: {
        return allocator->make<renderer::SolidLayer>(layerData);
    }
    case model::Layer::Type::Shape: {
        return allocator->make<renderer::ShapeLayer>(layerData, allocator);
    }
    case model::Layer::Type::Null: {
        return allocator->make<renderer::NullLayer>(layerData);
    }
    case model::Layer::Type::Image: {
        return allocator->make<renderer::ImageLayer>(layerData);
    }
    default:
        return nullptr;
        break;
    }
}